

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range_map.h
# Opt level: O0

string * bloaty::RangeMap::EntryDebugString
                   (uint64_t addr,uint64_t size,uint64_t other_start,string *label)

{
  long in_RCX;
  long in_RDX;
  AlphaNum *in_RDI;
  Hex *in_R8;
  string end;
  string *ret;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd18;
  char *c_str;
  AlphaNum *in_stack_fffffffffffffd20;
  AlphaNum *this;
  Hex *in_stack_fffffffffffffd28;
  AlphaNum *in_stack_fffffffffffffd30;
  allocator<char> *__a;
  AlphaNum *pAVar1;
  AlphaNum *b;
  AlphaNum *in_stack_fffffffffffffd88;
  Nonnull<std::string_*> in_stack_fffffffffffffd90;
  char local_208 [160];
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  AlphaNum *in_stack_fffffffffffffed8;
  AlphaNum *in_stack_fffffffffffffee0;
  AlphaNum *in_stack_fffffffffffffee8;
  AlphaNum *in_stack_fffffffffffffef0;
  AlphaNum *in_stack_fffffffffffffef8;
  Hex *in_stack_ffffffffffffff10;
  char (*in_stack_ffffffffffffff18) [4];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff20;
  allocator<char> local_49;
  string local_48 [32];
  Hex *local_28;
  long local_20;
  
  pAVar1 = in_RDI;
  local_28 = in_R8;
  local_20 = in_RCX;
  if (in_RDX == -1) {
    __a = &local_49;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pAVar1,
               (char *)in_RDI,__a);
    std::allocator<char>::~allocator(&local_49);
  }
  else {
    absl::Hex::Hex<unsigned_long>
              ((Hex *)in_stack_fffffffffffffd30,(unsigned_long)in_stack_fffffffffffffd28,
               (PadSpec)((ulong)in_stack_fffffffffffffd20 >> 0x38),in_stack_fffffffffffffd18);
    absl::strings_internal::StringifySink::StringifySink((StringifySink *)0x1a5d64);
    absl::AlphaNum::AlphaNum<absl::Hex,void>
              (in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,
               (StringifySink *)in_stack_fffffffffffffd20);
    absl::StrCat_abi_cxx11_(in_RDI);
    absl::strings_internal::StringifySink::~StringifySink((StringifySink *)0x1a5dba);
  }
  absl::AlphaNum::AlphaNum
            (in_stack_fffffffffffffd20,(Nullable<const_char_*>)in_stack_fffffffffffffd18);
  absl::Hex::Hex<unsigned_long>
            ((Hex *)in_stack_fffffffffffffd30,(unsigned_long)in_stack_fffffffffffffd28,
             (PadSpec)((ulong)in_stack_fffffffffffffd20 >> 0x38),in_stack_fffffffffffffd18);
  local_158 = 0;
  uStack_150 = 0;
  local_168 = 0;
  uStack_160 = 0;
  absl::strings_internal::StringifySink::StringifySink((StringifySink *)0x1a5e36);
  absl::AlphaNum::AlphaNum<absl::Hex,void>
            (in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,
             (StringifySink *)in_stack_fffffffffffffd20);
  absl::AlphaNum::AlphaNum
            (in_stack_fffffffffffffd20,(Nullable<const_char_*>)in_stack_fffffffffffffd18);
  absl::AlphaNum::AlphaNum<std::allocator<char>>
            (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
  absl::AlphaNum::AlphaNum
            (in_stack_fffffffffffffd20,(Nullable<const_char_*>)in_stack_fffffffffffffd18);
  absl::Hex::Hex<unsigned_long>
            ((Hex *)in_stack_fffffffffffffd30,(unsigned_long)in_stack_fffffffffffffd28,
             (PadSpec)((ulong)in_stack_fffffffffffffd20 >> 0x38),in_stack_fffffffffffffd18);
  this = (AlphaNum *)0x82642c;
  c_str = local_208;
  absl::StrCat<absl::Hex,char[4],std::__cxx11::string>
            (in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
             in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,in_stack_ffffffffffffff10,
             in_stack_ffffffffffffff18,in_stack_ffffffffffffff20);
  absl::strings_internal::StringifySink::~StringifySink((StringifySink *)0x1a5f1b);
  if (local_20 != -1) {
    absl::AlphaNum::AlphaNum(this,c_str);
    absl::Hex::Hex<unsigned_long>
              ((Hex *)in_stack_fffffffffffffd30,(unsigned_long)local_28,
               (PadSpec)((ulong)this >> 0x38),c_str);
    b = (AlphaNum *)0x0;
    absl::strings_internal::StringifySink::StringifySink((StringifySink *)0x1a5f79);
    absl::AlphaNum::AlphaNum<absl::Hex,void>
              (in_stack_fffffffffffffd30,local_28,(StringifySink *)this);
    absl::StrAppend(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,b);
    absl::strings_internal::StringifySink::~StringifySink((StringifySink *)0x1a5fb8);
  }
  std::__cxx11::string::~string(local_48);
  return (string *)pAVar1;
}

Assistant:

static std::string EntryDebugString(uint64_t addr, uint64_t size,
                                      uint64_t other_start,
                                      const std::string& label) {
    std::string end =
        size == kUnknownSize ? "?" : absl::StrCat(absl::Hex(addr + size));
    std::string ret = absl::StrCat("[", absl::Hex(addr), ", ", end,
                                   "] (size=", absl::Hex(size), "): ", label);
    if (other_start != UINT64_MAX) {
      absl::StrAppend(&ret, ", other_start=", absl::Hex(other_start));
    }
    return ret;
  }